

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

int jp2_cdef_putdata(jp2_box_t *box,jas_stream_t *out)

{
  int iVar1;
  uint_fast16_t *puVar2;
  jp2_cdefchan_t *ent;
  uint i;
  jp2_cdef_t *cdef;
  jas_stream_t *out_local;
  jp2_box_t *box_local;
  
  iVar1 = jp2_putuint16(out,(box->data).bpcc.numcmpts);
  if (iVar1 == 0) {
    for (ent._4_4_ = 0; (ulong)ent._4_4_ < (box->data).ftyp.majver; ent._4_4_ = ent._4_4_ + 1) {
      puVar2 = (uint_fast16_t *)((box->data).bpcc.bpcs + (ulong)ent._4_4_ * 0x18);
      iVar1 = jp2_putuint16(out,*puVar2);
      if (((iVar1 != 0) || (iVar1 = jp2_putuint16(out,puVar2[1]), iVar1 != 0)) ||
         (iVar1 = jp2_putuint16(out,puVar2[2]), iVar1 != 0)) {
        return -1;
      }
    }
    box_local._4_4_ = 0;
  }
  else {
    box_local._4_4_ = -1;
  }
  return box_local._4_4_;
}

Assistant:

static int jp2_cdef_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_cdef_t *cdef = &box->data.cdef;
	unsigned int i;
	jp2_cdefchan_t *ent;

	if (jp2_putuint16(out, cdef->numchans)) {
		return -1;
	}

	for (i = 0; i < cdef->numchans; ++i) {
		ent = &cdef->ents[i];
		if (jp2_putuint16(out, ent->channo) ||
		  jp2_putuint16(out, ent->type) ||
		  jp2_putuint16(out, ent->assoc)) {
			return -1;
		}
	}
	return 0;
}